

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall GlobOpt::TrackCalls(GlobOpt *this,Instr *instr)

{
  Instr **ppIVar1;
  uint *puVar2;
  undefined1 *puVar3;
  OpCode OVar4;
  Instr *this_00;
  Opnd *pOVar5;
  StackSym *pSVar6;
  BasicBlock *pBVar7;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  JitArenaAllocator *alloc;
  code *pcVar8;
  OpndKind OVar9;
  bool bVar10;
  uint32 uVar11;
  uint32 uVar12;
  uint uVar13;
  Instr **ppIVar14;
  Instr *pIVar15;
  Type pSVar16;
  undefined4 *puVar17;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar18;
  InlineeFrameInfo *pIVar19;
  Sym *pSVar20;
  GlobOptBlockData *pGVar21;
  Value *pVVar22;
  BVSparse<Memory::JitArenaAllocator> *pBVar23;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  uint uVar24;
  Instr *instrToMove;
  Instr *this_02;
  Instr *pIVar25;
  Instr *pIVar26;
  
  OVar4 = instr->m_opcode;
  if (OVar4 < CallHelper) {
    if (OVar4 < ArgOut_A_Dynamic) {
      if (OVar4 < ArgOut_A_Inline) {
        if (OVar4 == StartCall) {
          if ((this->field_0xf4 & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar17 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                ,0x20a,"(!this->isCallHelper)","!this->isCallHelper");
            if (!bVar10) goto LAB_00492a8a;
            *puVar17 = 0;
          }
          OVar9 = IR::Opnd::GetKind(instr->m_dst);
          if (OVar9 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar17 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                ,0x20b,"(instr->GetDst()->IsRegOpnd())",
                                "instr->GetDst()->IsRegOpnd()");
            if (!bVar10) goto LAB_00492a8a;
            *puVar17 = 0;
          }
          pOVar5 = instr->m_dst;
          OVar9 = IR::Opnd::GetKind(pOVar5);
          if (OVar9 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar17 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar10) goto LAB_00492a8a;
            *puVar17 = 0;
          }
          if (((ulong)pOVar5[1]._vptr_Opnd[3] & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar17 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                ,0x20c,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                                "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
            if (!bVar10) goto LAB_00492a8a;
            *puVar17 = 0;
          }
          if ((this->currentBlock->globOptData).callSequence ==
              (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            pSVar18 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                      new<Memory::JitArenaAllocator>(0x10,this->alloc,0x3f1274);
            (pSVar18->super_RealCount).count = 0;
            (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)pSVar18;
            (this->currentBlock->globOptData).callSequence = pSVar18;
          }
          pSVar18 = (this->currentBlock->globOptData).callSequence;
          pOVar5 = instr->m_dst;
          pSVar16 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,&this->alloc->super_ArenaAllocator,0x366bee);
          pSVar16[1].next = (Type)pOVar5;
          pSVar16->next = (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar16;
          (pSVar18->super_RealCount).count = (pSVar18->super_RealCount).count + 1;
          uVar13 = IR::Instr::GetArgOutCount(instr,true);
          pBVar7 = this->currentBlock;
          puVar2 = &(pBVar7->globOptData).totalOutParamCount;
          *puVar2 = *puVar2 + uVar13;
          puVar2 = &(pBVar7->globOptData).startCallCount;
          *puVar2 = *puVar2 + 1;
          return;
        }
        if (OVar4 == ArgOut_A) goto LAB_00491de7;
        if (OVar4 == IsInst) goto LAB_004921b3;
      }
      else if (OVar4 - 0x1ed < 2) goto LAB_00491de7;
    }
    else if (OVar4 - 0x1f0 < 4) {
LAB_00491de7:
      pOVar5 = instr->m_dst;
      OVar9 = IR::Opnd::GetKind(pOVar5);
      if (OVar9 == OpndKindSym) {
        if ((this->field_0xf4 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x229,"(!this->isCallHelper)","!this->isCallHelper");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        pSVar18 = (this->currentBlock->globOptData).callSequence;
        if ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
            (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x22a,"(!this->currentBlock->globOptData.callSequence->Empty())",
                              "!this->currentBlock->globOptData.callSequence->Empty()");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        OVar9 = IR::Opnd::GetKind(pOVar5);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                              ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        pSVar6 = (StackSym *)pOVar5[1]._vptr_Opnd;
        if ((pSVar6->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        if (((pSVar6->field_0x1b & 2) == 0) && (instr->m_opcode != ArgOut_A_FixupForStackArgs)) {
          pSVar18 = (this->currentBlock->globOptData).callSequence;
          pOVar5 = instr->m_dst;
          pSVar16 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,&this->alloc->super_ArenaAllocator,0x366bee);
          pSVar16[1].next = (Type)pOVar5;
          pSVar16->next = (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar16;
          (pSVar18->super_RealCount).count = (pSVar18->super_RealCount).count + 1;
          puVar2 = &(this->currentBlock->globOptData).argOutCount;
          *puVar2 = *puVar2 + 1;
        }
        if (((pSVar6->field_0x1a & 0x10) != 0) && (*(short *)&(pSVar6->super_Sym).field_0x16 == 0))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        if ((pSVar6->field_0x1a & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x234,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
          if (!bVar10) {
LAB_00492a8a:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          *puVar17 = 0;
        }
        if ((pSVar6->field_0x19 & 0x40) != 0) {
          uVar24 = 8;
          if (8 < (uint)TySize[instr->m_dst->m_type]) {
            uVar24 = TySize[instr->m_dst->m_type];
          }
          puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
          *puVar2 = *puVar2 + uVar24;
          if ((this->prePassLoop == (Loop *)0x0) && (-1 < pSVar6->m_offset)) {
            StackSym::FixupStackOffset(pSVar6,instr->m_func);
          }
        }
      }
      else {
        OVar9 = IR::Opnd::GetKind(pOVar5);
        if (OVar9 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x245,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
          if (!bVar10) goto LAB_00492a8a;
          *puVar17 = 0;
        }
        this->field_0xf4 = this->field_0xf4 | 1;
      }
      if (instr->m_opcode != ArgOut_A_FixupForStackArgs) {
        return;
      }
      if (this->prePassLoop != (Loop *)0x0) {
        return;
      }
      instr->m_opcode = ArgOut_A_Inline;
      return;
    }
    goto switchD_00491d7f_caseD_243;
  }
  switch(OVar4) {
  case BytecodeArgOutCapture:
    pSVar18 = (this->currentBlock->globOptData).callSequence;
    pOVar5 = instr->m_dst;
    pSVar16 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x366bee);
    pSVar16[1].next = (Type)pOVar5;
    pSVar16->next = (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
    (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar16;
    (pSVar18->super_RealCount).count = (pSVar18->super_RealCount).count + 1;
    puVar2 = &(this->currentBlock->globOptData).argOutCount;
    *puVar2 = *puVar2 + 1;
    break;
  case BytecodeArgOutUse:
  case ByteCodeUses:
  case BailOutStackRestore:
  case NoImplicitCallUses:
  case NoIntOverflowBoundary:
    goto switchD_00491d7f_caseD_243;
  case EndCallForPolymorphicInlinee:
    goto switchD_00491d7f_caseD_248;
  case InlineeStart:
    if (instr->m_func->parentFunc != (this->currentBlock->globOptData).curFunc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x252,
                          "(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc)"
                          ,
                          "instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc"
                         );
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    if (instr->m_func->parentFunc == (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x253,"(instr->m_func->GetParentFunc())","instr->m_func->GetParentFunc()"
                         );
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    pBVar7 = this->currentBlock;
    (pBVar7->globOptData).curFunc = instr->m_func;
    Func::UpdateMaxInlineeArgOutSize(this->func,(pBVar7->globOptData).inlinedArgOutSize);
    EndTrackCall(this,instr);
    pIVar19 = InlineeFrameInfo::New(instr->m_func->m_alloc);
    pSVar20 = IR::Opnd::GetSym(instr->m_src1);
    if (pSVar20 == (Sym *)0x0) {
      pVVar22 = (Value *)0x0;
    }
    else {
      pGVar21 = CurrentBlockData(this);
      pSVar20 = IR::Opnd::GetSym(instr->m_src1);
      pVVar22 = GlobOptBlockData::FindValue(pGVar21,pSVar20);
    }
    pIVar19->functionSymStartValue = pVVar22;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pGVar21->liveFloat64Syms,this->alloc);
    pIVar19->floatSyms = pBVar23;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = pGVar21->liveInt32Syms;
    pGVar21 = CurrentBlockData(this);
    bv2 = pGVar21->liveLossyInt32Syms;
    alloc = this->alloc;
    this_01 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
    this_01->head = (Type_conflict)0x0;
    this_01->lastFoundIndex = (Type_conflict)0x0;
    this_01->alloc = alloc;
    this_01->lastUsedNodePrevNextField = (Type)this_01;
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this_01,pBVar23,bv2);
    pIVar19->intSyms = this_01;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pGVar21->liveVarSyms,this->alloc);
    pIVar19->varSyms = pBVar23;
    bVar10 = DoInlineArgsOpt(instr->m_func);
    if (bVar10) {
      puVar3 = &instr->m_func->field_0x240;
      *puVar3 = *puVar3 | 2;
      instr->m_func->frameInfo = pIVar19;
    }
    else {
      instr->m_func->cachedInlineeFrameInfo = pIVar19;
    }
    break;
  case InlineeEnd:
    ProcessInlineeEnd(this,instr);
    return;
  case InlineeMetaArg:
    OVar9 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar9 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x27d,"(instr->GetDst()->IsSymOpnd())","instr->GetDst()->IsSymOpnd()");
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    pOVar5 = instr->m_dst;
    OVar9 = IR::Opnd::GetKind(pOVar5);
    if (OVar9 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    pSVar6 = (StackSym *)pOVar5[1]._vptr_Opnd;
    if ((pSVar6->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    if (((pSVar6->field_0x1a & 0x10) != 0) && (*(short *)&(pSVar6->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                          ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    if ((pSVar6->field_0x1a & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x27f,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    if (this->prePassLoop == (Loop *)0x0) {
      StackSym::FixupStackOffset(pSVar6,instr->m_func->parentFunc);
    }
    puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
    *puVar2 = *puVar2 + 8;
    break;
  case InlineBuiltInStart:
    this->field_0xf4 = this->field_0xf4 | 0x10;
    break;
  case InlineBuiltInEnd:
  case InlineNonTrackingBuiltInEnd:
    ppIVar1 = &instr->m_prev;
    ppIVar14 = ppIVar1;
    do {
      this_00 = *ppIVar14;
      ppIVar14 = &this_00->m_prev;
    } while (this_00->m_opcode != InlineBuiltInStart);
    this_02 = this_00->m_prev;
    pIVar15 = *ppIVar1;
    pIVar26 = pIVar15;
    for (; (pIVar25 = pIVar15, pIVar15->m_opcode == ByteCodeUses ||
           (pIVar25 = pIVar26, pIVar15->m_opcode != InlineBuiltInStart)); pIVar15 = pIVar15->m_prev)
    {
      pIVar26 = pIVar25;
    }
    IR::Instr::Unlink(this_00);
    if (pIVar26 != *ppIVar1) {
      pIVar26 = pIVar26->m_prev;
    }
    IR::Instr::InsertBefore(pIVar26,this_00);
    pIVar15 = this_00->m_prev;
    if ((this_02 != pIVar15) && (this_02->m_kind == InstrKindByteCodeUses)) {
      OVar4 = this_02->m_opcode;
      while (OVar4 == ByteCodeUses) {
        uVar11 = IR::Instr::GetByteCodeOffset(this_02);
        uVar12 = IR::Instr::GetByteCodeOffset(this_00);
        if (uVar11 != uVar12) break;
        pIVar26 = this_02->m_prev;
        IR::Instr::Unlink(this_02);
        IR::Instr::InsertAfter(pIVar15,this_02);
        if (pIVar26->m_kind != InstrKindByteCodeUses) break;
        this_02 = pIVar26;
        OVar4 = pIVar26->m_opcode;
      }
    }
    if (instr->m_opcode == InlineBuiltInEnd) {
      EndTrackCall(this,instr);
    }
    uVar24 = (this->currentBlock->globOptData).inlinedArgOutSize;
    uVar13 = IR::Instr::GetArgOutSize(instr,false);
    if (uVar24 < uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x2d2,
                          "(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false))"
                          ,
                          "this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false)"
                         );
      if (!bVar10) goto LAB_00492a8a;
      *puVar17 = 0;
    }
    uVar13 = IR::Instr::GetArgOutSize(instr,false);
    puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
    *puVar2 = *puVar2 - uVar13;
    this->field_0xf4 = this->field_0xf4 & 0xef;
    break;
  default:
    if (OVar4 == CallHelper) {
LAB_004921b3:
      if ((this->field_0xf4 & 1) != 0) {
LAB_00492212:
        this->field_0xf4 = this->field_0xf4 & 0xfe;
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0x273,"(this->isCallHelper)","this->isCallHelper");
      if (bVar10) {
        *puVar17 = 0;
        goto LAB_00492212;
      }
      goto LAB_00492a8a;
    }
    if (OVar4 == InlineArrayPop) goto switchD_00491d7f_caseD_248;
switchD_00491d7f_caseD_243:
    bVar10 = OpCodeAttr::CallInstr(OVar4);
    if ((bVar10) && (EndTrackCall(this,instr), (this->field_0xf4 & 0x10) != 0)) {
      OVar4 = instr->m_opcode;
      if (OVar4 < CallDirect) {
        if ((OVar4 == CallI) || (OVar4 == CallIDynamic)) {
switchD_00491d7f_caseD_248:
          EndTrackCall(this,instr);
          return;
        }
      }
      else if ((OVar4 == CallIFixed) || (OVar4 == CallDirect)) goto switchD_00491d7f_caseD_248;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackCalls(IR::Instr * instr)
{
    // Keep track of out params for bailout
    switch (instr->m_opcode)
    {
    case Js::OpCode::StartCall:
        Assert(!this->isCallHelper);
        Assert(instr->GetDst()->IsRegOpnd());
        Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);

        if (this->currentBlock->globOptData.callSequence == nullptr)
        {
            this->currentBlock->globOptData.callSequence = JitAnew(this->alloc, SListBase<IR::Opnd *>);
        }
        this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());

        this->currentBlock->globOptData.totalOutParamCount += instr->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
        this->currentBlock->globOptData.startCallCount++;

        break;
    case Js::OpCode::BytecodeArgOutCapture:
        {
            this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
            this->currentBlock->globOptData.argOutCount++;
            break;
        }
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    {
        IR::Opnd * opnd = instr->GetDst();
        if (opnd->IsSymOpnd())
        {
            Assert(!this->isCallHelper);
            Assert(!this->currentBlock->globOptData.callSequence->Empty());
            StackSym* stackSym = opnd->AsSymOpnd()->m_sym->AsStackSym();

            // These scenarios are already tracked using BytecodeArgOutCapture,
            // and we don't want to be tracking ArgOut_A_FixupForStackArgs as these are only visible to the JIT and we should not be restoring them upon bailout.
            if (!stackSym->m_isArgCaptured && instr->m_opcode != Js::OpCode::ArgOut_A_FixupForStackArgs)
            {
                this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
                this->currentBlock->globOptData.argOutCount++;
            }
            Assert(stackSym->IsArgSlotSym());
            if (stackSym->m_isInlinedArgSlot)
            {
                uint size = TySize[instr->GetDst()->GetType()];
                this->currentBlock->globOptData.inlinedArgOutSize += size < MachPtr ? MachPtr : size;
                // We want to update the offsets only once: don't do in prepass.
                if (!this->IsLoopPrePass() && stackSym->m_offset >= 0)
                {
                    Func * currentFunc = instr->m_func;
                    stackSym->FixupStackOffset(currentFunc);
                }
            }
        }
        else
        {
            // It is a reg opnd if it is a helper call
            // It should be all ArgOut until the CallHelper instruction
            Assert(opnd->IsRegOpnd());
            this->isCallHelper = true;
        }

        if (instr->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs && !this->IsLoopPrePass())
        {
            instr->m_opcode = Js::OpCode::ArgOut_A_Inline;
        }
        break;
    }

    case Js::OpCode::InlineeStart:
    {
        Assert(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc);
        Assert(instr->m_func->GetParentFunc());
        this->currentBlock->globOptData.curFunc = instr->m_func;

        this->func->UpdateMaxInlineeArgOutSize(this->currentBlock->globOptData.inlinedArgOutSize);
        this->EndTrackCall(instr);

        InlineeFrameInfo* inlineeFrameInfo = InlineeFrameInfo::New(instr->m_func->m_alloc);
        inlineeFrameInfo->functionSymStartValue = instr->GetSrc1()->GetSym() ?
            CurrentBlockData()->FindValue(instr->GetSrc1()->GetSym()) : nullptr;
        inlineeFrameInfo->floatSyms = CurrentBlockData()->liveFloat64Syms->CopyNew(this->alloc);
        inlineeFrameInfo->intSyms = CurrentBlockData()->liveInt32Syms->MinusNew(CurrentBlockData()->liveLossyInt32Syms, this->alloc);
        inlineeFrameInfo->varSyms = CurrentBlockData()->liveVarSyms->CopyNew(this->alloc);

        if (DoInlineArgsOpt(instr->m_func))
        {
            instr->m_func->m_hasInlineArgsOpt = true;
            instr->m_func->frameInfo = inlineeFrameInfo;
        }
        else
        {
            instr->m_func->cachedInlineeFrameInfo = inlineeFrameInfo;
        }
        break;
    }

    case Js::OpCode::EndCallForPolymorphicInlinee:
        // Have this opcode mimic the functions of both InlineeStart and InlineeEnd in the bailout block of a polymorphic call inlined using fixed methods.
        this->EndTrackCall(instr);
        break;

    case Js::OpCode::CallHelper:
    case Js::OpCode::IsInst:
        Assert(this->isCallHelper);
        this->isCallHelper = false;
        break;

    case Js::OpCode::InlineeEnd:
        ProcessInlineeEnd(instr);
        break;

    case Js::OpCode::InlineeMetaArg:
    {
        Assert(instr->GetDst()->IsSymOpnd());
        StackSym * stackSym = instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        Assert(stackSym->IsArgSlotSym());

        // InlineeMetaArg has the m_func set as the "inlinee" and not the "inliner"
        // TODO: Review this and fix the m_func of InlineeMetaArg to be "inliner" (as for the rest of the ArgOut's)
        // We want to update the offsets only once: don't do in prepass.
        if (!this->IsLoopPrePass())
        {
            Func * currentFunc = instr->m_func->GetParentFunc();
            stackSym->FixupStackOffset(currentFunc);
        }
        this->currentBlock->globOptData.inlinedArgOutSize += MachPtr;
        break;
    }

    case Js::OpCode::InlineBuiltInStart:
        this->inInlinedBuiltIn = true;
        break;

    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::InlineBuiltInEnd:
    {
        // If extra bailouts were added for the InlineMathXXX call itself,
        // move InlineeBuiltInStart just above the InlineMathXXX.
        // This is needed so that the function argument has lifetime after all bailouts for InlineMathXXX,
        // otherwise when we bailout we would get wrong function.
        IR::Instr* inlineBuiltInStartInstr = instr->m_prev;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Instr *byteCodeUsesInstr = inlineBuiltInStartInstr->m_prev;
        IR::Instr * insertBeforeInstr = instr->m_prev;
        IR::Instr * tmpInstr = insertBeforeInstr;
        while(tmpInstr->m_opcode != Js::OpCode::InlineBuiltInStart )
        {
            if(tmpInstr->m_opcode == Js::OpCode::ByteCodeUses)
            {
                insertBeforeInstr = tmpInstr;
            }
            tmpInstr = tmpInstr->m_prev;
        }
        inlineBuiltInStartInstr->Unlink();
        if(insertBeforeInstr == instr->m_prev)
        {
            insertBeforeInstr->InsertBefore(inlineBuiltInStartInstr);
        }

        else
        {
            insertBeforeInstr->m_prev->InsertBefore(inlineBuiltInStartInstr);
        }

        // Need to move the byte code uses instructions associated with inline built-in start instruction as well. For instance,
        // copy-prop may have replaced the function sym and inserted a byte code uses for the original sym holding the function.
        // That byte code uses instruction needs to appear after bailouts inserted for the InlinMathXXX instruction since the
        // byte code register holding the function object needs to be restored on bailout.
        IR::Instr *const insertByteCodeUsesAfterInstr = inlineBuiltInStartInstr->m_prev;
        if(byteCodeUsesInstr != insertByteCodeUsesAfterInstr)
        {
            // The InlineBuiltInStart instruction was moved, look for its ByteCodeUses instructions that also need to be moved
            while(
                byteCodeUsesInstr->IsByteCodeUsesInstr() &&
                byteCodeUsesInstr->AsByteCodeUsesInstr()->GetByteCodeOffset() == inlineBuiltInStartInstr->GetByteCodeOffset())
            {
                IR::Instr *const instrToMove = byteCodeUsesInstr;
                byteCodeUsesInstr = byteCodeUsesInstr->m_prev;
                instrToMove->Unlink();
                insertByteCodeUsesAfterInstr->InsertAfter(instrToMove);
            }
        }

        // The following code makes more sense to be processed when we hit InlineeBuiltInStart,
        // but when extra bailouts are added for the InlineMathXXX and InlineArrayPop instructions itself, those bailouts
        // need to know about current bailout record, but since they are added after TrackCalls is called
        // for InlineeBuiltInStart, we can't clear current record when got InlineeBuiltInStart

        // Do not track calls for InlineNonTrackingBuiltInEnd, as it is already tracked for InlineArrayPop
        if(instr->m_opcode == Js::OpCode::InlineBuiltInEnd)
        {
            this->EndTrackCall(instr);
        }

        Assert(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false));
        this->currentBlock->globOptData.inlinedArgOutSize -= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false);

        this->inInlinedBuiltIn = false;
        break;
    }

    case Js::OpCode::InlineArrayPop:
    {
        // EndTrackCall should be called here as the Post-op BailOutOnImplicitCalls will bail out to the instruction after the Pop function call instr.
        // This bailout shouldn't be tracking the call sequence as it will then erroneously reserve stack space for arguments when the call would have already happened
        // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for InlineArrayPop.
        this->EndTrackCall(instr);
        break;
    }

    default:
        if (OpCodeAttr::CallInstr(instr->m_opcode))
        {
            this->EndTrackCall(instr);
            // With `InlineeBuiltInStart` and `InlineeBuiltInEnd` surrounding CallI/CallIDirect/CallIDynamic/CallIFixed,
            // we are not popping the call sequence correctly. That makes the bailout code thinks that we need to restore
            // argouts of the remaining call even though we shouldn't.
            // Also see Inline::InlineApplyWithArgumentsObject,  Inline::InlineApplyWithoutArrayArgument, Inline::InlineCall
            // in which we set the end tag instruction's opcode to InlineNonTrackingBuiltInEnd
            if (this->inInlinedBuiltIn &&
                (instr->m_opcode == Js::OpCode::CallDirect || instr->m_opcode == Js::OpCode::CallI ||
                 instr->m_opcode == Js::OpCode::CallIDynamic || instr->m_opcode == Js::OpCode::CallIFixed))
            {
                // We can end up in this situation when a built-in apply target is inlined to a CallDirect. We have the following IR:
                //
                // StartCall
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // InlineBuiltInStart
                //      ArgOut_A_InlineSpecialized
                //      ArgOut_A
                //      ArgOut_A
                //      CallDirect
                // InlineNonTrackingBuiltInEnd
                //
                // We need to call EndTrackCall twice for CallDirect in this case. The CallDirect may get a BailOutOnImplicitCalls later,
                // but it should not be tracking the call sequence for the apply call as it is a post op bailout and the call would have
                // happened when we bail out.
                // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for CallDirect.
                this->EndTrackCall(instr);
            }
        }
        break;
    }
}